

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall wasm::TranslateToFuzzReader::shuffleExports(TranslateToFuzzReader *this)

{
  undefined8 uVar1;
  uint32_t uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  
  if ((*(long *)this->wasm != *(long *)(this->wasm + 8)) &&
     (this->preserveImportsAndExports == false)) {
    uVar2 = Random::upTo(&this->random,2);
    if (uVar2 != 0) {
      lVar4 = *(long *)(this->wasm + 8) - *(long *)this->wasm;
      if (lVar4 != 8) {
        lVar4 = lVar4 >> 3;
        iVar6 = 0;
        uVar5 = 0;
        do {
          uVar2 = Random::upTo(&this->random,(int)lVar4 + iVar6);
          if (uVar2 != 0) {
            uVar3 = (ulong)(uVar2 + (int)uVar5);
            lVar4 = *(long *)this->wasm;
            uVar1 = *(undefined8 *)(lVar4 + uVar5 * 8);
            *(undefined8 *)(lVar4 + uVar5 * 8) = *(undefined8 *)(lVar4 + uVar3 * 8);
            *(undefined8 *)(lVar4 + uVar3 * 8) = uVar1;
          }
          uVar5 = (ulong)((int)uVar5 + 1);
          lVar4 = *(long *)(this->wasm + 8) - *(long *)this->wasm >> 3;
          iVar6 = iVar6 + -1;
        } while (uVar5 < lVar4 - 1U);
      }
      wasm::Module::updateMaps();
      return;
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::shuffleExports() {
  // Randomly ordering the exports is useful for a few reasons. First, initial
  // content may have a natural order in which to execute things (an "init"
  // export first, for example), and changing that order may lead to very
  // different execution. Second, even in the fuzzer's own random content there
  // is a "direction", since we generate as we go (e.g. no function calls a
  // later function that does not exist yet / will be created later), and also
  // we emit invokes for a function right after it (so we end up calling the
  // same code several times in succession, but interleaving it with others may
  // find more things). But we also keep a good chance for the natural order
  // here, as it may help some initial content. Note we cannot do this if we are
  // preserving the exports, as their order is something we must maintain.
  if (wasm.exports.empty() || preserveImportsAndExports || oneIn(2)) {
    return;
  }

  // Sort the exports in the simple Fisher-Yates manner.
  // https://en.wikipedia.org/wiki/Fisher%E2%80%93Yates_shuffle#The_modern_algorithm
  for (Index i = 0; i < wasm.exports.size() - 1; i++) {
    // Pick the index of the item to place at index |i|. The number of items to
    // pick from begins at the full length, then decreases with i.
    auto j = i + upTo(wasm.exports.size() - i);

    // Swap the item over here.
    if (j != i) {
      std::swap(wasm.exports[i], wasm.exports[j]);
    }
  }

  wasm.updateMaps();
}